

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O1

CoatedConductorMaterial *
pbrt::CoatedConductorMaterial::Create
          (TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ParameterDictionary *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uintptr_t iptr_1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CoatedConductorMaterial *pCVar7;
  uintptr_t iptr;
  ushort uVar8;
  FloatTextureHandle g;
  SpectrumTextureHandle albedo;
  FloatTextureHandle conductorVRoughness;
  FloatTextureHandle conductorURoughness;
  FloatTextureHandle interfaceVRoughness;
  FloatTextureHandle interfaceURoughness;
  FloatTextureHandle displacement;
  SpectrumTextureHandle k;
  SpectrumTextureHandle conductorEta;
  FloatTextureHandle interfaceEta;
  FloatTextureHandle thickness;
  string local_e0;
  undefined1 local_c0 [32];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [24];
  pbrt local_68 [8];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  ParameterDictionary *local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
  *local_38;
  undefined4 extraout_var_01;
  
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"interface.uroughness","");
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)local_80,(string *)parameters,
             (memory_resource *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"interface.vroughness","");
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)(local_90 + 8),(string *)parameters,
             (memory_resource *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((local_80._0_8_ & 0xffffffffffff) == 0) {
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"interface.roughness","");
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)local_c0,(string *)parameters,0.0,
               (memory_resource *)&local_e0);
    local_80._0_8_ = local_c0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_90._8_8_ & 0xffffffffffff) == 0) {
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"interface.roughness","");
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)local_c0,(string *)parameters,0.0,
               (memory_resource *)&local_e0);
    local_90._8_8_ = local_c0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"thickness","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&local_40,(string *)parameters,0.01,
             (memory_resource *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"interface.eta","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)(local_50 + 8),(string *)parameters,1.5,
             (memory_resource *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"conductor.uroughness","");
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)local_90,(string *)parameters,
             (memory_resource *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"conductor.vroughness","");
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)(local_a0 + 8),(string *)parameters,
             (memory_resource *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((local_90._0_8_ & 0xffffffffffff) == 0) {
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"conductor.roughness","");
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)local_c0,(string *)parameters,0.0,
               (memory_resource *)&local_e0);
    local_90._0_8_ = local_c0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_a0._8_8_ & 0xffffffffffff) == 0) {
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"conductor.roughness","");
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)local_c0,(string *)parameters,0.0,
               (memory_resource *)&local_e0);
    local_a0._8_8_ = local_c0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"conductor.eta","");
  pPVar2 = (ParameterDictionary *)(local_c0 + 0x10);
  local_c0._0_8_ = pPVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"metal-Cu-eta","");
  GetNamedSpectrum((pbrt *)(local_60 + 8),(string *)local_c0);
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)local_50,(string *)parameters,(SpectrumHandle *)&local_e0
             ,(int)local_60 + 8,(Allocator)0x1);
  if ((ParameterDictionary *)local_c0._0_8_ != pPVar2) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"conductor.k","");
  local_c0._0_8_ = pPVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"metal-Cu-k","");
  GetNamedSpectrum(local_68,(string *)local_c0);
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)local_60,(string *)parameters,(SpectrumHandle *)&local_e0
             ,(SpectrumType)local_68,(Allocator)0x1);
  if ((ParameterDictionary *)local_c0._0_8_ != pPVar2) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"maxdepth","");
  local_80._12_4_ = TextureParameterDictionary::GetOneInt(parameters,&local_e0,10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"nsamples","");
  iVar4 = TextureParameterDictionary::GetOneInt(parameters,&local_e0,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"g","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_c0,(string *)parameters,0.0,
             (memory_resource *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"albedo","");
  local_38 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
              *)0x0;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)local_a0,(string *)parameters,(SpectrumHandle *)&local_e0
             ,(SpectrumType)&local_38,(Allocator)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((local_a0._0_8_ & 0xffffffffffff) == 0) {
    iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var,iVar5) = 0;
    iVar6 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8,8);
    *(ulong *)CONCAT44(extraout_var_00,iVar6) = CONCAT44(extraout_var,iVar5) | 0x1000000000000;
    local_a0._0_8_ = CONCAT44(extraout_var_00,iVar6) | 0x7000000000000;
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"displacement","");
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)(local_80 + 0x10),(string *)parameters,
             (memory_resource *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"remaproughness","");
  bVar3 = TextureParameterDictionary::GetOneBool(parameters,&local_e0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x60,8);
  pCVar7 = (CoatedConductorMaterial *)CONCAT44(extraout_var_01,iVar5);
  uVar8 = (ushort)local_80[0xc] | (ushort)(iVar4 << 8);
  (pCVar7->displacement).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_80._16_8_;
  (pCVar7->interfaceURoughness).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_80._0_8_;
  (pCVar7->interfaceVRoughness).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_90._8_8_;
  (pCVar7->thickness).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = (uintptr_t)local_40;
  (pCVar7->interfaceEta).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_50._8_8_;
  (pCVar7->g).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_c0._0_8_;
  (pCVar7->albedo).
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_a0._0_8_;
  (pCVar7->conductorURoughness).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_90._0_8_;
  (pCVar7->conductorVRoughness).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_a0._8_8_;
  (pCVar7->conductorEta).
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_50._0_8_;
  (pCVar7->k).
  super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_60._0_8_;
  pCVar7->remapRoughness = bVar3;
  (pCVar7->config).maxDepth = (char)uVar8;
  (pCVar7->config).nSamples = (char)(uVar8 >> 8);
  (pCVar7->config).twoSided = '\x01';
  return pCVar7;
}

Assistant:

CoatedConductorMaterial *CoatedConductorMaterial::Create(
    const TextureParameterDictionary &parameters, const FileLoc *loc, Allocator alloc) {
    // interface
    FloatTextureHandle interfaceURoughness =
        parameters.GetFloatTextureOrNull("interface.uroughness", alloc);
    FloatTextureHandle interfaceVRoughness =
        parameters.GetFloatTextureOrNull("interface.vroughness", alloc);
    if (!interfaceURoughness)
        interfaceURoughness =
            parameters.GetFloatTexture("interface.roughness", 0.f, alloc);
    if (!interfaceVRoughness)
        interfaceVRoughness =
            parameters.GetFloatTexture("interface.roughness", 0.f, alloc);

    FloatTextureHandle thickness = parameters.GetFloatTexture("thickness", .01, alloc);
    FloatTextureHandle interfaceEta =
        parameters.GetFloatTexture("interface.eta", 1.5, alloc);

    // conductor
    FloatTextureHandle conductorURoughness =
        parameters.GetFloatTextureOrNull("conductor.uroughness", alloc);
    FloatTextureHandle conductorVRoughness =
        parameters.GetFloatTextureOrNull("conductor.vroughness", alloc);
    if (!conductorURoughness)
        conductorURoughness =
            parameters.GetFloatTexture("conductor.roughness", 0.f, alloc);
    if (!conductorVRoughness)
        conductorVRoughness =
            parameters.GetFloatTexture("conductor.roughness", 0.f, alloc);
    SpectrumTextureHandle conductorEta = parameters.GetSpectrumTexture(
        "conductor.eta", GetNamedSpectrum("metal-Cu-eta"), SpectrumType::General, alloc);
    SpectrumTextureHandle k = parameters.GetSpectrumTexture(
        "conductor.k", GetNamedSpectrum("metal-Cu-k"), SpectrumType::General, alloc);

    LayeredBxDFConfig config;
    config.maxDepth = parameters.GetOneInt("maxdepth", config.maxDepth);
    config.nSamples = parameters.GetOneInt("nsamples", config.nSamples);

    FloatTextureHandle g = parameters.GetFloatTexture("g", 0.f, alloc);
    SpectrumTextureHandle albedo = parameters.GetSpectrumTexture(
        "albedo", nullptr, SpectrumType::Reflectance, alloc);
    if (!albedo)
        albedo = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.f));

    FloatTextureHandle displacement =
        parameters.GetFloatTextureOrNull("displacement", alloc);
    bool remapRoughness = parameters.GetOneBool("remaproughness", true);

    return alloc.new_object<CoatedConductorMaterial>(
        interfaceURoughness, interfaceVRoughness, thickness, interfaceEta, g, albedo,
        conductorURoughness, conductorVRoughness, conductorEta, k, displacement,
        remapRoughness, config);
}